

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode Curl_connect(Curl_easy *data,connectdata **in_connect,_Bool *asyncp,_Bool *protocol_done)

{
  byte bVar1;
  curl_proxytype cVar2;
  uint uVar3;
  void *pvVar4;
  _Bool _Var5;
  byte bVar6;
  char cVar7;
  int iVar8;
  CURLcode CVar9;
  CURLcode CVar10;
  Curl_easy *pCVar11;
  size_t sVar12;
  connectdata *pcVar13;
  char *pcVar14;
  curl_llist *pcVar15;
  size_t sVar16;
  char *pcVar17;
  long lVar18;
  undefined8 uVar19;
  char *pcVar20;
  size_t sVar21;
  byte *pbVar22;
  size_t sVar23;
  byte *pbVar24;
  ulong uVar25;
  char *pcVar26;
  connectdata *pcVar27;
  Curl_handler **ppCVar28;
  _Bool *p_Var29;
  conncache *pcVar30;
  char **optionsp_00;
  Curl_handler *pCVar31;
  bool bVar32;
  timeval tVar33;
  _Bool waitpipe;
  _Bool force_reuse;
  char *options;
  char *passwd;
  char *user;
  char slashbuf [4];
  char *newname;
  char *optionsp;
  char *passwdp;
  connectdata *conn_temp;
  char protobuf [16];
  _Bool local_c2;
  _Bool local_c1;
  byte *local_c0;
  undefined4 local_b4;
  hostname *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  Curl_easy *local_80;
  size_t local_78;
  char *local_70;
  char *local_68;
  _Bool *local_60;
  connectdata *local_58;
  _Bool *local_50;
  _Bool local_48 [24];
  
  pcVar14 = (char *)0x0;
  *asyncp = false;
  local_58 = (connectdata *)0x0;
  local_98 = (char *)0x0;
  local_a0 = (char *)0x0;
  local_a8 = (char *)0x0;
  local_c1 = false;
  local_c2 = false;
  local_60 = protocol_done;
  pCVar11 = (Curl_easy *)Curl_multi_max_host_connections(data->multi);
  sVar12 = Curl_multi_max_total_connections(data->multi);
  *asyncp = false;
  if ((data->change).url == (char *)0x0) {
    CVar10 = CURLE_URL_MALFORMAT;
    pcVar17 = (char *)0x0;
    goto LAB_0011f144;
  }
  local_80 = pCVar11;
  local_78 = sVar12;
  pcVar13 = (connectdata *)(*Curl_ccalloc)(1,0x700);
  CVar10 = CURLE_OUT_OF_MEMORY;
  if (pcVar13 == (connectdata *)0x0) goto LAB_0011f13f;
  pcVar13->handler = &Curl_handler_dummy;
  pcVar13->connection_id = -1;
  pcVar13->port = -1;
  pcVar13->remote_port = -1;
  pcVar13->sock[0] = -1;
  pcVar13->sock[1] = -1;
  pcVar13->tempsock[0] = -1;
  pcVar13->tempsock[1] = -1;
  Curl_conncontrol(pcVar13,1);
  tVar33 = curlx_tvnow();
  pcVar13->created = tVar33;
  pcVar13->data = data;
  cVar2 = (data->set).proxytype;
  (pcVar13->http_proxy).proxytype = cVar2;
  (pcVar13->socks_proxy).proxytype = CURLPROXY_SOCKS4;
  pcVar14 = (data->set).str[0x15];
  if (pcVar14 == (char *)0x0) {
    (pcVar13->bits).proxy = false;
LAB_0011d89f:
    (pcVar13->bits).httpproxy = false;
    bVar32 = false;
  }
  else {
    bVar32 = *pcVar14 == '\0';
    (pcVar13->bits).proxy = !bVar32;
    if (bVar32) goto LAB_0011d89f;
    bVar32 = cVar2 >= (CURLPROXY_HTTPS|CURLPROXY_HTTP_1_0);
    (pcVar13->bits).httpproxy = cVar2 < (CURLPROXY_HTTPS|CURLPROXY_HTTP_1_0);
  }
  (pcVar13->bits).socksproxy = bVar32;
  pcVar14 = (data->set).str[0x16];
  if ((pcVar14 != (char *)0x0) && (*pcVar14 != '\0')) {
    (pcVar13->bits).proxy = true;
    (pcVar13->bits).socksproxy = true;
  }
  (pcVar13->bits).proxy_user_passwd = (data->set).str[0x2c] != (char *)0x0;
  (pcVar13->bits).tunnel_proxy = (data->set).tunnel_thru_httpproxy;
  (pcVar13->bits).user_passwd = (data->set).str[0x29] != (char *)0x0;
  (pcVar13->bits).ftp_use_epsv = (data->set).ftp_use_epsv;
  (pcVar13->bits).ftp_use_eprt = (data->set).ftp_use_eprt;
  (pcVar13->ssl_config).verifystatus = (data->set).ssl.primary.verifystatus;
  (pcVar13->ssl_config).verifypeer = (data->set).ssl.primary.verifypeer;
  (pcVar13->ssl_config).verifyhost = (data->set).ssl.primary.verifyhost;
  (pcVar13->proxy_ssl_config).verifystatus = (data->set).proxy_ssl.primary.verifystatus;
  (pcVar13->proxy_ssl_config).verifypeer = (data->set).proxy_ssl.primary.verifypeer;
  (pcVar13->proxy_ssl_config).verifyhost = (data->set).proxy_ssl.primary.verifyhost;
  pcVar13->ip_version = (data->set).ipver;
  _Var5 = Curl_pipeline_wanted(data->multi,1);
  if ((_Var5) && (pcVar13->master_buffer == (char *)0x0)) {
    pcVar14 = (char *)(*Curl_ccalloc)(0x4000,1);
    pcVar13->master_buffer = pcVar14;
    if (pcVar14 != (char *)0x0) goto LAB_0011d9bf;
  }
  else {
LAB_0011d9bf:
    pcVar15 = Curl_llist_alloc(llist_dtor);
    pcVar13->send_pipe = pcVar15;
    pcVar15 = Curl_llist_alloc(llist_dtor);
    pcVar13->recv_pipe = pcVar15;
    if (pcVar15 != (curl_llist *)0x0 && pcVar13->send_pipe != (curl_llist *)0x0) {
      pcVar14 = (data->set).str[8];
      if (pcVar14 != (char *)0x0) {
        pcVar14 = (*Curl_cstrdup)(pcVar14);
        pcVar13->localdev = pcVar14;
        if (pcVar14 == (char *)0x0) goto LAB_0011d9f9;
      }
      pcVar13->localportrange = (data->set).localportrange;
      pcVar13->localport = (data->set).localport;
      pvVar4 = (data->set).closesocket_client;
      pcVar13->fclosesocket = (data->set).fclosesocket;
      pcVar13->closesocket_client = pvVar4;
      *in_connect = pcVar13;
      sVar16 = strlen((data->change).url);
      sVar21 = 0x100;
      if (0x100 < sVar16) {
        sVar21 = sVar16;
      }
      (*Curl_cfree)((data->state).pathbuffer);
      (data->state).pathbuffer = (char *)0x0;
      (data->state).path = (char *)0x0;
      pcVar14 = (char *)(*Curl_cmalloc)(sVar21 + 2);
      (data->state).pathbuffer = pcVar14;
      if (pcVar14 != (char *)0x0) {
        (data->state).path = pcVar14;
        pcVar14 = (char *)(*Curl_cmalloc)(sVar21 + 2);
        (pcVar13->host).rawalloc = pcVar14;
        if (pcVar14 != (char *)0x0) {
          (pcVar13->host).name = pcVar14;
          *pcVar14 = '\0';
          pcVar14 = (*Curl_cstrdup)("");
          local_98 = pcVar14;
          pcVar17 = (*Curl_cstrdup)("");
          local_a0 = pcVar17;
          local_a8 = (*Curl_cstrdup)("");
          CVar10 = CURLE_OUT_OF_MEMORY;
          if (local_a8 == (char *)0x0 || (pcVar17 == (char *)0x0 || pcVar14 == (char *)0x0)) {
LAB_0011e7ce:
            pcVar14 = (char *)0x0;
LAB_0011e7d8:
            pcVar17 = (char *)0x0;
            goto LAB_0011f144;
          }
          pbVar24 = (byte *)(data->state).path;
          pbVar22 = (byte *)(data->change).url;
          pcVar14 = strpbrk((char *)pbVar22,"\r\n");
          if (pcVar14 == (char *)0x0) {
            if (*pbVar22 != 0x3a) {
              local_c0 = pbVar24;
              if ((((byte)((*pbVar22 & 0xdf) + 0xbf) < 0x1a) && (pbVar22[1] == 0x3a)) &&
                 (pcVar14 = (data->set).str[7], pcVar14 != (char *)0x0)) {
                iVar8 = Curl_strcasecompare(pcVar14,"file");
                if (iVar8 == 0) {
                  pbVar22 = (byte *)(data->change).url;
                  goto LAB_0011dc48;
                }
              }
              else {
LAB_0011dc48:
                lVar18 = 0;
                do {
                  bVar6 = pbVar22[lVar18];
                  if ((bVar6 == 0) || (bVar6 == 0x2f)) break;
                  if (bVar6 == 0x3a) {
                    iVar8 = Curl_strncasecompare((char *)pbVar22,"file:",5);
                    if (iVar8 == 0) goto LAB_0011dd56;
                    iVar8 = __isoc99_sscanf((data->change).url,"%*15[^\n/:]:%[^\n]",pbVar24);
                    if (iVar8 != 1) goto LAB_0011dd95;
                    bVar6 = *pbVar24;
                    if (bVar6 != 0x2f) goto LAB_0011dcb3;
                    if (pbVar24[1] == 0x2f) {
                      pbVar22 = local_c0 + 2;
                      sVar21 = strlen((char *)pbVar22);
                      pbVar24 = local_c0;
                      memmove(local_c0,pbVar22,sVar21 + 1);
                    }
                    goto LAB_0011dcb1;
                  }
                  lVar18 = lVar18 + 1;
                } while (lVar18 != 0x10);
              }
              pcVar14 = (data->set).str[7];
              if ((pcVar14 == (char *)0x0) ||
                 (iVar8 = Curl_strcasecompare(pcVar14,"file"), iVar8 == 0)) {
LAB_0011dd56:
                *pbVar24 = 0;
                pcVar14 = local_48;
                uVar19 = __isoc99_sscanf((data->change).url,"%15[^\n/:]:%3[/]%[^\n/?#]%[^\n]",
                                         pcVar14,&local_90,(pcVar13->host).name);
                iVar8 = (int)uVar19;
                if (iVar8 == 2) goto LAB_0011dd95;
                local_b4 = (undefined4)CONCAT71((int7)((ulong)uVar19 >> 8),iVar8 < 3);
                if (2 < iVar8) {
                  sVar21 = strlen((char *)&local_90);
                  if (sVar21 == 2) {
LAB_0011df5f:
                    pcVar17 = (pcVar13->host).name;
                    pcVar20 = strchr(pcVar17,0x40);
                    pcVar26 = pcVar20 + 1;
                    if (pcVar20 == (char *)0x0) {
                      pcVar26 = pcVar17;
                    }
                    pcVar17 = strchr(pcVar26,0x3f);
                    local_b0 = (hostname *)CONCAT71(local_b0._1_7_,pcVar17 != (char *)0x0);
                    if (pcVar17 == (char *)0x0) {
                      bVar6 = *local_c0;
                      pbVar24 = local_c0;
                      if (bVar6 != 0) goto LAB_0011dff5;
                      local_c0[0] = 0x2f;
                      local_c0[1] = 0;
                      local_b0 = (hostname *)CONCAT71(local_b0._1_7_,1);
LAB_0011e03b:
                      pbVar22 = pbVar24;
                      if ((data->set).path_as_is == false) {
                        pbVar22 = (byte *)Curl_dedotdotify((char *)pbVar24);
                        if (pbVar22 == (byte *)0x0) goto LAB_0011e1c5;
                        iVar8 = strcmp((char *)pbVar22,(char *)pbVar24);
                        if (iVar8 != 0) {
                          (*Curl_cfree)((data->state).pathbuffer);
                          (data->state).pathbuffer = (char *)pbVar22;
                          (data->state).path = (char *)pbVar22;
                          goto LAB_0011e09d;
                        }
                        (*Curl_cfree)(pbVar22);
                        pbVar22 = local_c0;
                      }
                      if ((char)local_b0 == '\0') goto LAB_0011e186;
                    }
                    else {
                      sVar21 = strlen(pcVar17);
                      pbVar24 = local_c0;
                      local_50 = (_Bool *)pcVar14;
                      sVar16 = strlen((char *)local_c0);
                      memmove(pbVar24 + sVar21 + 1,pbVar24,sVar16 + 1);
                      pcVar14 = local_50;
                      memcpy(pbVar24 + 1,pcVar17,sVar21);
                      *pbVar24 = 0x2f;
                      *pcVar17 = '\0';
                      bVar6 = *pbVar24;
LAB_0011dff5:
                      if (bVar6 == 0x2f) goto LAB_0011e03b;
                      pbVar24 = local_c0 + 1;
                      sVar21 = strlen((char *)local_c0);
                      pbVar22 = local_c0;
                      memmove(pbVar24,local_c0,sVar21 + 1);
                      *pbVar22 = 0x2f;
                    }
LAB_0011e09d:
                    local_c0 = pbVar22;
                    local_b0 = (hostname *)strlen((char *)pbVar22);
                    sVar21 = strlen((data->change).url);
                    sVar16 = strlen((pcVar13->host).name);
                    if ((char)local_b4 == '\0') {
                      sVar23 = strlen(pcVar14);
                      sVar16 = sVar16 + sVar23 + 3;
                    }
                    pcVar17 = (char *)(*Curl_cmalloc)(sVar21 + 2);
                    if (pcVar17 != (char *)0x0) {
                      memcpy(pcVar17,(data->change).url,sVar16);
                      memcpy(pcVar17 + sVar16,local_c0,(size_t)((long)&local_b0->rawalloc + 1));
                      if ((data->change).url_alloc == true) {
                        (*Curl_cfree)((data->change).url);
                        (data->change).url = (char *)0x0;
                        (data->change).url_alloc = false;
                      }
                      Curl_infof(data,"Rebuilt URL to: %s\n",pcVar17);
                      (data->change).url = pcVar17;
                      (data->change).url_alloc = true;
                      pbVar22 = local_c0;
LAB_0011e186:
                      local_b0 = &pcVar13->host;
                      pCVar31 = &Curl_handler_http;
                      ppCVar28 = protocols;
                      local_c0 = pbVar22;
LAB_0011e1a5:
                      ppCVar28 = ppCVar28 + 1;
                      iVar8 = Curl_strcasecompare(pCVar31->scheme,pcVar14);
                      if (iVar8 == 0) goto code_r0x0011e1b4;
                      if ((((uint)(data->set).allowed_protocols & pCVar31->protocol) != 0) &&
                         (((data->state).this_is_a_follow != true ||
                          (((uint)(data->set).redir_protocols & pCVar31->protocol) != 0)))) {
                        pcVar13->given = pCVar31;
                        pcVar13->handler = pCVar31;
                        CVar10 = CURLE_OK;
                        local_90 = (char *)0x0;
                        local_68 = (char *)0x0;
                        local_70 = (char *)0x0;
                        pcVar14 = (pcVar13->host).name;
                        pcVar17 = strchr(pcVar14,0x40);
                        if (pcVar17 != (char *)0x0) {
                          (pcVar13->host).name = pcVar17 + 1;
                          if ((data->set).use_netrc != CURL_NETRC_REQUIRED) {
                            optionsp_00 = &local_70;
                            if ((pCVar31->flags >> 10 & 1) == 0) {
                              optionsp_00 = (char **)0x0;
                            }
                            CVar10 = parse_login_details(pcVar14,(size_t)(pcVar17 + 1 +
                                                                         ~(ulong)pcVar14),&local_90,
                                                         &local_68,optionsp_00);
                            if (CVar10 == CURLE_OK) {
                              if (local_90 != (char *)0x0) {
                                (pcVar13->bits).userpwd_in_url = true;
                                (pcVar13->bits).user_passwd = true;
                                CVar10 = Curl_urldecode(data,local_90,0,&local_88,(size_t *)0x0,
                                                        false);
                                if (CVar10 != CURLE_OK) goto LAB_0011e30e;
                                (*Curl_cfree)(local_98);
                                local_98 = local_88;
                              }
                              if (local_68 != (char *)0x0) {
                                CVar10 = Curl_urldecode(data,local_68,0,&local_88,(size_t *)0x0,
                                                        false);
                                if (CVar10 != CURLE_OK) goto LAB_0011e30e;
                                (*Curl_cfree)(local_a0);
                                local_a0 = local_88;
                              }
                              if (local_70 == (char *)0x0) {
                                CVar10 = CURLE_OK;
                              }
                              else {
                                CVar10 = Curl_urldecode(data,local_70,0,&local_88,(size_t *)0x0,
                                                        false);
                                if (CVar10 == CURLE_OK) {
                                  (*Curl_cfree)(local_a8);
                                  local_a8 = local_88;
                                }
                              }
                            }
                          }
                        }
LAB_0011e30e:
                        (*Curl_cfree)(local_90);
                        (*Curl_cfree)(local_68);
                        (*Curl_cfree)(local_70);
                        if (CVar10 != CURLE_OK) goto LAB_0011f13f;
                        pcVar14 = (pcVar13->host).name;
                        if ((*pcVar14 == '[') &&
                           (pbVar24 = (byte *)strchr(pcVar14,0x25), pbVar24 != (byte *)0x0)) {
                          iVar8 = *pbVar24 - 0x25;
                          if ((iVar8 == 0) && (iVar8 = pbVar24[1] - 0x32, iVar8 == 0)) {
                            iVar8 = 0x35 - (uint)pbVar24[2];
                          }
                          else {
                            iVar8 = -iVar8;
                          }
                          if (iVar8 == 0) {
                            lVar18 = 3;
                          }
                          else {
                            Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.\n");
                            lVar18 = 1;
                          }
                          uVar25 = strtoul((char *)(pbVar24 + lVar18),&local_90,10);
                          pcVar14 = local_90;
                          if (*local_90 == ']') {
                            sVar21 = strlen(local_90);
                            memmove(pbVar24,pcVar14,sVar21 + 1);
                            pcVar13->scope_id = (uint)uVar25;
                          }
                          else {
                            Curl_infof(data,"Invalid IPv6 address format\n");
                          }
                        }
                        uVar3 = (data->set).scope_id;
                        if (uVar3 != 0) {
                          pcVar13->scope_id = uVar3;
                        }
                        pcVar14 = strchr((char *)local_c0,0x23);
                        if (pcVar14 != (char *)0x0) {
                          *pcVar14 = '\0';
                          pcVar14 = strchr((data->change).url,0x23);
                          if (pcVar14 != (char *)0x0) {
                            *pcVar14 = '\0';
                          }
                        }
                        if ((char)local_b4 == '\0') goto LAB_0011e547;
                        pcVar14 = (char *)0x0;
                        pbVar24 = (byte *)curl_maprintf("%s://%s",pcVar13->handler->scheme,
                                                        (data->change).url);
                        if (pbVar24 != (byte *)0x0) {
                          bVar6 = *pbVar24;
                          pbVar22 = pbVar24;
                          while (bVar6 != 0x3a) {
                            iVar8 = tolower((uint)bVar6);
                            *pbVar22 = (byte)iVar8;
                            bVar6 = pbVar22[1];
                            pbVar22 = pbVar22 + 1;
                          }
                          if ((data->change).url_alloc == true) {
                            (*Curl_cfree)((data->change).url);
                          }
                          (data->change).url = (char *)pbVar24;
                          (data->change).url_alloc = true;
LAB_0011e547:
                          if (((pcVar13->given->flags & 0x40) != 0) &&
                             (pcVar14 = strchr((pcVar13->data->state).path,0x3f),
                             pcVar14 != (char *)0x0)) {
                            *pcVar14 = '\0';
                          }
                          pcVar14 = (data->set).str[0x35];
                          if (pcVar14 == (char *)0x0) {
LAB_0011e597:
                            if (((pcVar13->bits).proxy_user_passwd == true) &&
                               (CVar10 = parse_proxy_auth(data,pcVar13), CVar10 != CURLE_OK))
                            goto LAB_0011ea5c;
                            pcVar14 = (data->set).str[0x15];
                            if (pcVar14 != (char *)0x0) {
                              pcVar17 = (*Curl_cstrdup)(pcVar14);
                              if (pcVar17 != (char *)0x0) goto LAB_0011e5ed;
                              pcVar14 = (char *)0x0;
                              Curl_failf(data,"memory shortage");
                              goto LAB_0011eeb3;
                            }
                            pcVar17 = (char *)0x0;
LAB_0011e5ed:
                            pcVar14 = (data->set).str[0x16];
                            if (pcVar14 != (char *)0x0) {
                              pcVar14 = (*Curl_cstrdup)(pcVar14);
                              if (pcVar14 != (char *)0x0) goto LAB_0011e627;
                              pcVar14 = (char *)0x0;
                              Curl_failf(data,"memory shortage");
                              goto LAB_0011dbd4;
                            }
                            pcVar14 = (char *)0x0;
LAB_0011e627:
                            pcVar26 = curl_getenv("no_proxy");
                            if (pcVar26 == (char *)0x0) {
                              pcVar26 = curl_getenv("NO_PROXY");
                            }
                            _Var5 = check_noproxy((pcVar13->host).name,(data->set).str[0x2e]);
                            if ((_Var5) ||
                               (((data->set).str[0x2e] == (char *)0x0 &&
                                (_Var5 = check_noproxy((pcVar13->host).name,pcVar26), _Var5)))) {
                              (*Curl_cfree)(pcVar17);
                              (*Curl_cfree)(pcVar14);
                              pcVar14 = (char *)0x0;
                              pcVar17 = (char *)0x0;
                            }
                            else if (pcVar17 == (char *)0x0 && pcVar14 == (char *)0x0) {
                              pcVar17 = detect_proxy((connectdata *)pcVar13->handler->scheme);
                              pcVar14 = (char *)0x0;
                            }
                            (*Curl_cfree)(pcVar26);
                            pcVar26 = (data->set).str[0x36];
                            if (pcVar26 == (char *)0x0) {
                              if (pcVar17 == (char *)0x0) goto LAB_0011e734;
                              if ((*pcVar17 == '\0') || ((pcVar13->handler->flags & 0x10) != 0)) {
                                (*Curl_cfree)(pcVar17);
                                goto LAB_0011e734;
                              }
                            }
                            else {
                              if (pcVar17 != (char *)0x0) {
                                (*Curl_cfree)(pcVar17);
                                pcVar26 = (data->set).str[0x36];
                              }
                              pcVar17 = (*Curl_cstrdup)(pcVar26);
                              pcVar13->unix_domain_socket = pcVar17;
                              if (pcVar17 == (char *)0x0) goto LAB_0011eeb3;
                              pcVar13->abstract_unix_socket = (data->set).abstract_unix_socket;
LAB_0011e734:
                              pcVar17 = (char *)0x0;
                            }
                            if (pcVar14 == (char *)0x0) {
LAB_0011e764:
                              if (pcVar17 == (char *)0x0) {
                                (pcVar13->bits).httpproxy = false;
LAB_0011e81d:
                                (pcVar13->bits).proxy = false;
                                (pcVar13->bits).httpproxy = false;
                                bVar6 = 0;
                                (pcVar13->bits).socksproxy = false;
                                (pcVar13->bits).proxy_user_passwd = false;
                                (pcVar13->bits).tunnel_proxy = false;
                                goto LAB_0011e904;
                              }
                              pcVar14 = (char *)0x0;
                              bVar32 = false;
LAB_0011e773:
                              CVar10 = parse_proxy(data,pcVar13,pcVar17,
                                                   (pcVar13->http_proxy).proxytype);
                              (*Curl_cfree)(pcVar17);
                              if (CVar10 == CURLE_OK) {
                                if (bVar32) goto LAB_0011e7a3;
                                goto LAB_0011e8a8;
                              }
                              goto LAB_0011e7d8;
                            }
                            if ((*pcVar14 == '\0') || ((pcVar13->handler->flags & 0x10) != 0)) {
                              (*Curl_cfree)(pcVar14);
                              goto LAB_0011e764;
                            }
                            bVar32 = true;
                            if (pcVar17 != (char *)0x0) goto LAB_0011e773;
LAB_0011e7a3:
                            CVar10 = parse_proxy(data,pcVar13,pcVar14,
                                                 (pcVar13->socks_proxy).proxytype);
                            (*Curl_cfree)(pcVar14);
                            if (CVar10 != CURLE_OK) goto LAB_0011e7ce;
LAB_0011e8a8:
                            if ((pcVar13->http_proxy).host.rawalloc == (char *)0x0) {
                              (pcVar13->bits).httpproxy = false;
                              (pcVar13->bits).tunnel_proxy = false;
                              if ((pcVar13->socks_proxy).host.rawalloc == (char *)0x0)
                              goto LAB_0011e81d;
                              if ((pcVar13->socks_proxy).user != (char *)0x0) {
                                (pcVar13->bits).socksproxy = true;
                                (pcVar13->bits).proxy = true;
                                bVar6 = 0;
                                goto LAB_0011e904;
                              }
                              pcVar14 = (pcVar13->socks_proxy).passwd;
                              (pcVar13->socks_proxy).user = (pcVar13->http_proxy).user;
                              (pcVar13->http_proxy).user = (char *)0x0;
                              (*Curl_cfree)(pcVar14);
                              (pcVar13->socks_proxy).passwd = (pcVar13->http_proxy).passwd;
                              (pcVar13->http_proxy).passwd = (char *)0x0;
                              bVar6 = (pcVar13->bits).httpproxy;
                              (pcVar13->bits).socksproxy = true;
                            }
                            else {
                              if (((pcVar13->handler->protocol & 3) == 0) &&
                                 ((pcVar13->bits).tunnel_proxy == false)) {
                                pcVar13->handler = &Curl_handler_http;
                              }
                              (pcVar13->bits).httpproxy = true;
                              (pcVar13->bits).socksproxy =
                                   (pcVar13->socks_proxy).host.rawalloc != (char *)0x0;
                              bVar6 = 1;
                            }
                            (pcVar13->bits).proxy = true;
LAB_0011e904:
                            p_Var29 = &(pcVar13->bits).httpproxy;
                            if (((pcVar13->given->flags & 1) != 0) && ((bVar6 & 1) != 0)) {
                              (pcVar13->bits).tunnel_proxy = true;
                            }
                            CVar10 = parse_remote_port(data,pcVar13);
                            if ((((CVar10 != CURLE_OK) ||
                                 (CVar10 = override_login(data,pcVar13,&local_98,&local_a0,&local_a8
                                                         ), CVar10 != CURLE_OK)) ||
                                (CVar10 = set_login(pcVar13,local_98,local_a0,local_a8),
                                CVar10 != CURLE_OK)) ||
                               (CVar10 = parse_connect_to_slist(data,pcVar13,(data->set).connect_to)
                               , CVar10 != CURLE_OK)) {
LAB_0011ea5c:
                              pcVar14 = (char *)0x0;
                              goto LAB_0011e7d8;
                            }
                            fix_hostname((connectdata *)pcVar13->data,local_b0);
                            if ((pcVar13->bits).conn_to_host == true) {
                              fix_hostname((connectdata *)pcVar13->data,&pcVar13->conn_to_host);
                            }
                            if (*p_Var29 == true) {
                              fix_hostname((connectdata *)pcVar13->data,&(pcVar13->http_proxy).host)
                              ;
                            }
                            if ((pcVar13->bits).socksproxy == true) {
                              fix_hostname((connectdata *)pcVar13->data,&(pcVar13->socks_proxy).host
                                          );
                            }
                            if (((pcVar13->bits).conn_to_host == true) &&
                               (iVar8 = Curl_strcasecompare((pcVar13->conn_to_host).name,
                                                            (pcVar13->host).name), iVar8 != 0)) {
                              (pcVar13->bits).conn_to_host = false;
                            }
                            cVar7 = (pcVar13->bits).conn_to_port;
                            if (((_Bool)cVar7 == true) &&
                               (pcVar13->conn_to_port == pcVar13->remote_port)) {
                              (pcVar13->bits).conn_to_port = false;
                              cVar7 = '\0';
                            }
                            if ((((pcVar13->bits).conn_to_host != false) || (cVar7 != '\0')) &&
                               (*p_Var29 == true)) {
                              (pcVar13->bits).tunnel_proxy = true;
                            }
                            CVar10 = setup_connection_internals(pcVar13);
                            if (CVar10 != CURLE_OK) goto LAB_0011ea5c;
                            pcVar13->recv[0] = Curl_recv_plain;
                            pcVar13->send[0] = Curl_send_plain;
                            pcVar13->recv[1] = Curl_recv_plain;
                            pcVar13->send[1] = Curl_send_plain;
                            (pcVar13->bits).tcp_fastopen = (data->set).tcp_fastopen;
                            if ((pcVar13->handler->flags & 0x10) != 0) {
                              CVar9 = (*pcVar13->handler->connect_it)(pcVar13,local_48);
                              if (CVar9 == CURLE_OK) {
                                pcVar13->data = data;
                                (pcVar13->bits).tcpconnect[0] = true;
                                Curl_conncache_add_conn((data->state).conn_cache,pcVar13);
                                CVar10 = setup_range(data);
                                if (CVar10 != CURLE_OK) {
                                  (*pcVar13->handler->done)(pcVar13,CVar10,false);
                                  goto LAB_0011e7ce;
                                }
                                Curl_setup_transfer(pcVar13,-1,-1,false,(curl_off_t *)0x0,-1,
                                                    (curl_off_t *)0x0);
                              }
                              Curl_init_do(data,pcVar13);
                              CVar10 = CVar9;
                              goto LAB_0011e7ce;
                            }
                            pcVar14 = (data->set).str[0x1b];
                            (data->set).ssl.primary.CApath = (data->set).str[0x1a];
                            (data->set).proxy_ssl.primary.CApath = pcVar14;
                            (data->set).ssl.primary.CAfile = (data->set).str[0x1c];
                            (data->set).proxy_ssl.primary.CAfile = (data->set).str[0x1d];
                            pcVar14 = (data->set).str[0x23];
                            (data->set).ssl.primary.random_file = pcVar14;
                            (data->set).proxy_ssl.primary.random_file = pcVar14;
                            pcVar14 = (data->set).str[0x22];
                            (data->set).ssl.primary.egdsocket = pcVar14;
                            (data->set).proxy_ssl.primary.egdsocket = pcVar14;
                            (data->set).ssl.primary.cipher_list = (data->set).str[0x20];
                            (data->set).proxy_ssl.primary.cipher_list = (data->set).str[0x21];
                            (data->set).ssl.CRLfile = (data->set).str[0x25];
                            (data->set).proxy_ssl.CRLfile = (data->set).str[0x26];
                            (data->set).ssl.issuercert = (data->set).str[0x27];
                            (data->set).proxy_ssl.issuercert = (data->set).str[0x28];
                            pcVar14 = (data->set).str[0];
                            pcVar17 = (data->set).str[1];
                            (data->set).ssl.cert = pcVar14;
                            (data->set).proxy_ssl.cert = pcVar17;
                            (data->set).ssl.cert_type = (data->set).str[2];
                            (data->set).proxy_ssl.cert_type = (data->set).str[3];
                            (data->set).ssl.key = (data->set).str[0xd];
                            (data->set).proxy_ssl.key = (data->set).str[0xe];
                            (data->set).ssl.key_type = (data->set).str[0x11];
                            (data->set).proxy_ssl.key_type = (data->set).str[0x12];
                            pcVar26 = (data->set).str[0x10];
                            (data->set).ssl.key_passwd = (data->set).str[0xf];
                            (data->set).proxy_ssl.key_passwd = pcVar26;
                            (data->set).ssl.primary.clientcert = pcVar14;
                            (data->set).proxy_ssl.primary.clientcert = pcVar17;
                            _Var5 = Curl_clone_primary_ssl_config
                                              (&(data->set).ssl.primary,&pcVar13->ssl_config);
                            if ((!_Var5) ||
                               (_Var5 = Curl_clone_primary_ssl_config
                                                  (&(data->set).proxy_ssl.primary,
                                                   &pcVar13->proxy_ssl_config), !_Var5))
                            goto LAB_0011eeb0;
                            prune_dead_connections(data);
                            if ((((data->set).reuse_fresh == true) &&
                                ((data->state).this_is_a_follow != true)) ||
                               (_Var5 = ConnectionExists(data,pcVar13,&local_58,&local_c1,&local_c2)
                               , pcVar27 = local_58, !_Var5)) {
LAB_0011ee3d:
                              if ((pcVar13->handler->flags & 0x100) != 0) {
                                if ((data->set).ssl_enable_alpn == true) {
                                  (pcVar13->bits).tls_enable_alpn = true;
                                }
                                if ((data->set).ssl_enable_npn == true) {
                                  (pcVar13->bits).tls_enable_npn = true;
                                }
                              }
                              if (local_c2 != false) {
LAB_0011ee7b:
                                pcVar14 = (char *)0x0;
                                Curl_infof(data,"No connections available.\n");
                                conn_free(pcVar13);
                                *in_connect = (connectdata *)0x0;
                                CVar10 = CURLE_NO_CONNECTION_AVAILABLE;
                                goto LAB_0011e7d8;
                              }
                              pcVar30 = (data->state).conn_cache;
                              pCVar11 = (Curl_easy *)Curl_conncache_find_bundle(pcVar13,pcVar30);
                              if ((pCVar11 != (Curl_easy *)0x0 && local_80 != (Curl_easy *)0x0) &&
                                 (local_80 <= pCVar11->prev)) {
                                pcVar27 = find_oldest_idle_connection_in_bundle
                                                    (pCVar11,(connectbundle *)pcVar30);
                                if (pcVar27 == (connectdata *)0x0) {
                                  Curl_infof(data,"No more connections allowed to host: %d\n",
                                             local_80);
                                  goto LAB_0011ee7b;
                                }
                                pcVar27->data = data;
                                Curl_disconnect(pcVar27,false);
                              }
                              pcVar30 = (data->state).conn_cache;
                              if ((local_78 != 0) && (local_78 <= pcVar30->num_connections)) {
                                pcVar27 = Curl_oldest_idle_connection(data);
                                if (pcVar27 == (connectdata *)0x0) {
                                  Curl_infof(data,"No connections available in cache\n");
                                  goto LAB_0011ee7b;
                                }
                                pcVar27->data = data;
                                Curl_disconnect(pcVar27,false);
                                pcVar30 = (data->state).conn_cache;
                              }
                              Curl_conncache_add_conn(pcVar30,pcVar13);
                              if ((((data->state).authhost.picked & 0x28) != 0) &&
                                 ((data->state).authhost.done == true)) {
                                Curl_infof(data,"NTLM picked AND auth done set, clear picked!\n");
                                (data->state).authhost.picked = 0;
                                (data->state).authhost.done = false;
                              }
                              if ((((data->state).authproxy.picked & 0x28) != 0) &&
                                 ((data->state).authproxy.done == true)) {
                                Curl_infof(data,
                                           "NTLM-proxy picked AND auth done set, clear picked!\n");
                                (data->state).authproxy.picked = 0;
                                (data->state).authproxy.done = false;
                              }
                            }
                            else {
                              if (((local_c1 == false) &&
                                  (_Var5 = IsPipeliningPossible(data,local_58), _Var5)) &&
                                 ((pcVar27->recv_pipe->size + pcVar27->send_pipe->size != 0 &&
                                  ((Curl_infof(data,
                                               "Found connection %ld, with requests in the pipe (%zu)\n"
                                               ,pcVar27->connection_id),
                                   (Curl_easy *)pcVar27->bundle->num_connections < local_80 &&
                                   (((data->state).conn_cache)->num_connections < local_78)))))) {
                                Curl_infof(data,
                                           "We can reuse, but we want a new connection anyway\n");
                                goto LAB_0011ee3d;
                              }
                              pcVar27->inuse = true;
                              reuse_conn(pcVar13,pcVar27);
                              (*Curl_cfree)(pcVar13);
                              *in_connect = pcVar27;
                              pcVar14 = "host";
                              if ((pcVar27->bits).proxy != false) {
                                pcVar14 = "proxy";
                              }
                              lVar18 = 0x110;
                              if (((pcVar27->socks_proxy).host.name == (char *)0x0) &&
                                 (lVar18 = 0x150, (pcVar27->http_proxy).host.name == (char *)0x0)) {
                                lVar18 = 200;
                              }
                              Curl_infof(data,"Re-using existing connection! (#%ld) with %s %s\n",
                                         pcVar27->connection_id,pcVar14,
                                         *(undefined8 *)((pcVar27->chunk).hexbuffer + lVar18 + -8));
                              pcVar13 = pcVar27;
                            }
                            pcVar13->inuse = true;
                            Curl_init_do(data,pcVar13);
                            CVar10 = setup_range(data);
                            if (CVar10 != CURLE_OK) goto LAB_0011e7ce;
                            pcVar13->seek_func = (data->set).seek_func;
                            pcVar13->seek_client = (data->set).seek_client;
                            CVar10 = resolve_server(data,pcVar13,asyncp);
                            goto LAB_0011f13f;
                          }
                          pcVar14 = (*Curl_cstrdup)(pcVar14);
                          pcVar13->oauth_bearer = pcVar14;
                          if (pcVar14 != (char *)0x0) goto LAB_0011e597;
LAB_0011eeb0:
                          pcVar14 = (char *)0x0;
                        }
LAB_0011eeb3:
                        pcVar17 = (char *)0x0;
                        goto LAB_0011dbd4;
                      }
                      goto LAB_0011e379;
                    }
                  }
                  else {
                    pcVar14 = "";
                    if (1 < sVar21) {
                      pcVar14 = "es";
                    }
                    Curl_infof(data,"Unwillingly accepted illegal URL using %d slash%s!\n",sVar21,
                               pcVar14);
                    if ((data->change).url_alloc == true) {
                      (*Curl_cfree)((data->change).url);
                    }
                    pcVar14 = local_48;
                    pcVar17 = curl_maprintf("%s://%s%s",pcVar14,(pcVar13->host).name,local_c0);
                    (data->change).url = pcVar17;
                    if (pcVar17 != (char *)0x0) {
                      (data->change).url_alloc = true;
                      goto LAB_0011df5f;
                    }
                  }
LAB_0011e1c5:
                  CVar10 = CURLE_OUT_OF_MEMORY;
                  goto LAB_0011f13f;
                }
                iVar8 = __isoc99_sscanf((data->change).url,"%[^\n/?#]%[^\n]",(pcVar13->host).name,
                                        local_c0);
                if (0 < iVar8) {
                  pcVar14 = (data->set).str[7];
                  if ((_Bool *)pcVar14 == (_Bool *)0x0) {
                    iVar8 = curl_strnequal("FTP.",(pcVar13->host).name,4);
                    if (iVar8 == 0) {
                      iVar8 = curl_strnequal("DICT.",(pcVar13->host).name,5);
                      if (iVar8 == 0) {
                        iVar8 = curl_strnequal("LDAP.",(pcVar13->host).name,5);
                        if (iVar8 == 0) {
                          iVar8 = curl_strnequal("IMAP.",(pcVar13->host).name,5);
                          if (iVar8 == 0) {
                            iVar8 = curl_strnequal("SMTP.",(pcVar13->host).name,5);
                            if (iVar8 == 0) {
                              iVar8 = curl_strnequal("POP3.",(pcVar13->host).name,5);
                              pcVar14 = "pop3";
                              if (iVar8 == 0) {
                                pcVar14 = "http";
                              }
                            }
                            else {
                              pcVar14 = "smtp";
                            }
                          }
                          else {
                            pcVar14 = "IMAP";
                          }
                        }
                        else {
                          pcVar14 = "LDAP";
                        }
                      }
                      else {
                        pcVar14 = "DICT";
                      }
                    }
                    else {
                      pcVar14 = "ftp";
                    }
                  }
                  goto LAB_0011df5f;
                }
                pcVar14 = "<url> malformed";
              }
              else {
                iVar8 = __isoc99_sscanf((data->change).url,"%[^\n]",pbVar24);
                if (iVar8 == 1) {
LAB_0011dcb1:
                  bVar6 = *pbVar24;
LAB_0011dcb3:
                  if ((byte)((bVar6 & 0xdf) + 0xbf) < 0x1a) {
                    bVar1 = pbVar24[1];
                    if (bVar6 != 0x2f && bVar1 != 0x3a) {
LAB_0011dec3:
                      iVar8 = curl_strnequal("localhost/",(char *)pbVar24,10);
                      if ((iVar8 == 0) &&
                         (iVar8 = curl_strnequal("127.0.0.1/",(char *)pbVar24,10), iVar8 == 0)) {
                        pcVar14 = 
                        "Invalid file://hostname/, expected localhost or 127.0.0.1 or none";
                        goto LAB_0011dd9c;
                      }
                      pbVar24 = local_c0 + 9;
                      if (local_c0[10] == 0x2f) {
                        pbVar24 = local_c0 + 10;
                      }
                      sVar21 = strlen((char *)pbVar24);
                      pbVar22 = local_c0;
                      memmove(local_c0,pbVar24,sVar21 + 1);
                      if (0x19 < (byte)((*pbVar22 & 0xdf) + 0xbf)) goto LAB_0011df57;
                      bVar1 = pbVar22[1];
                    }
                    if (bVar1 == 0x3a) {
                      pcVar14 = "File drive letters are only accepted in MSDOS/Windows.";
                      goto LAB_0011dd9c;
                    }
                  }
                  else if (bVar6 != 0x2f) goto LAB_0011dec3;
LAB_0011df57:
                  pcVar14 = "file";
                  local_b4 = 0;
                  goto LAB_0011df5f;
                }
LAB_0011dd95:
                pcVar14 = "Bad URL";
              }
LAB_0011dd9c:
              Curl_failf(data,pcVar14);
              CVar10 = CURLE_URL_MALFORMAT;
              goto LAB_0011f13f;
            }
            pcVar14 = "Bad URL, colon is first character";
          }
          else {
            pcVar14 = "Illegal characters found in URL";
          }
          Curl_failf(data,pcVar14);
          CVar10 = CURLE_URL_MALFORMAT;
          goto LAB_0011f13f;
        }
        (*Curl_cfree)((data->state).pathbuffer);
        (data->state).pathbuffer = (char *)0x0;
        (data->state).path = (char *)0x0;
      }
      pcVar14 = (char *)0x0;
      pcVar17 = (char *)0x0;
LAB_0011dbd4:
      CVar10 = CURLE_OUT_OF_MEMORY;
      goto LAB_0011f144;
    }
  }
LAB_0011d9f9:
  Curl_llist_destroy(pcVar13->send_pipe,(void *)0x0);
  Curl_llist_destroy(pcVar13->recv_pipe,(void *)0x0);
  pcVar13->send_pipe = (curl_llist *)0x0;
  pcVar13->recv_pipe = (curl_llist *)0x0;
  (*Curl_cfree)(pcVar13->master_buffer);
  (*Curl_cfree)(pcVar13->localdev);
  (*Curl_cfree)(pcVar13);
  goto LAB_0011f13f;
code_r0x0011e1b4:
  pCVar31 = *ppCVar28;
  if (pCVar31 == (Curl_handler *)0x0) goto LAB_0011e379;
  goto LAB_0011e1a5;
LAB_0011e379:
  Curl_failf(data,"Protocol \"%s\" not supported or disabled in libcurl",pcVar14);
  CVar10 = CURLE_UNSUPPORTED_PROTOCOL;
LAB_0011f13f:
  pcVar17 = (char *)0x0;
  pcVar14 = (char *)0x0;
LAB_0011f144:
  (*Curl_cfree)(local_a8);
  (*Curl_cfree)(local_a0);
  (*Curl_cfree)(local_98);
  (*Curl_cfree)(pcVar14);
  (*Curl_cfree)(pcVar17);
  if (CVar10 == CURLE_OK) {
    pcVar13 = *in_connect;
    if ((pcVar13->send_pipe->size != 0) || (pcVar13->recv_pipe->size != 0)) {
      *local_60 = true;
      return CURLE_OK;
    }
    if (*asyncp != false) {
      return CURLE_OK;
    }
    CVar10 = Curl_setup_conn(pcVar13,local_60);
  }
  if (CVar10 != CURLE_OK) {
    if (CVar10 == CURLE_NO_CONNECTION_AVAILABLE) {
      *in_connect = (connectdata *)0x0;
      CVar10 = CURLE_NO_CONNECTION_AVAILABLE;
    }
    else if (*in_connect != (connectdata *)0x0) {
      Curl_disconnect(*in_connect,false);
      *in_connect = (connectdata *)0x0;
    }
  }
  return CVar10;
}

Assistant:

CURLcode Curl_connect(struct Curl_easy *data,
                      struct connectdata **in_connect,
                      bool *asyncp,
                      bool *protocol_done)
{
  CURLcode result;

  *asyncp = FALSE; /* assume synchronous resolves by default */

  /* call the stuff that needs to be called */
  result = create_conn(data, in_connect, asyncp);

  if(!result) {
    /* no error */
    if((*in_connect)->send_pipe->size || (*in_connect)->recv_pipe->size)
      /* pipelining */
      *protocol_done = TRUE;
    else if(!*asyncp) {
      /* DNS resolution is done: that's either because this is a reused
         connection, in which case DNS was unnecessary, or because DNS
         really did finish already (synch resolver/fast async resolve) */
      result = Curl_setup_conn(*in_connect, protocol_done);
    }
  }

  if(result == CURLE_NO_CONNECTION_AVAILABLE) {
    *in_connect = NULL;
    return result;
  }

  if(result && *in_connect) {
    /* We're not allowed to return failure with memory left allocated
       in the connectdata struct, free those here */
    Curl_disconnect(*in_connect, FALSE); /* close the connection */
    *in_connect = NULL;           /* return a NULL */
  }

  return result;
}